

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utf8SourceInfo.cpp
# Opt level: O2

void __thiscall Js::Utf8SourceInfo::SetFunctionBody(Utf8SourceInfo *this,FunctionBody *functionBody)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  ScriptContext *pSVar5;
  undefined4 *puVar6;
  FunctionBody *local_38;
  FunctionBody *functionBody_local;
  FunctionBody *oldFunctionBody;
  LocalFunctionId functionId;
  
  pSVar1 = (this->m_scriptContext).ptr;
  local_38 = functionBody;
  pSVar5 = FunctionProxy::GetScriptContext((FunctionProxy *)functionBody);
  if (pSVar1 != pSVar5) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/Utf8SourceInfo.cpp"
                                ,0x7d,"(this->m_scriptContext == functionBody->GetScriptContext())",
                                "this->m_scriptContext == functionBody->GetScriptContext()");
    if (!bVar3) goto LAB_0072937f;
    *puVar6 = 0;
  }
  if ((this->functionBodyDictionary).ptr ==
      (SynchronizedDictionary<unsigned_int,_Js::FunctionBody_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_Js::DefaultContainerLockPolicy,_CriticalSection>
       *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/Utf8SourceInfo.cpp"
                                ,0x7e,"(this->functionBodyDictionary)",
                                "this->functionBodyDictionary");
    if (!bVar3) goto LAB_0072937f;
    *puVar6 = 0;
  }
  uVar4 = ParseableFunctionInfo::GetSourceIndex(&functionBody->super_ParseableFunctionInfo);
  if (uVar4 == 0xffffffff) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/Utf8SourceInfo.cpp"
                                ,0x81,
                                "(functionBody->GetSourceIndex() != Js::Constants::InvalidSourceIndex)"
                                ,
                                "functionBody->GetSourceIndex() != Js::Constants::InvalidSourceIndex"
                               );
    if (!bVar3) goto LAB_0072937f;
    *puVar6 = 0;
  }
  if ((functionBody->field_0x178 & 8) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/Utf8SourceInfo.cpp"
                                ,0x82,"(!functionBody->GetIsFuncRegistered())",
                                "!functionBody->GetIsFuncRegistered()");
    if (!bVar3) goto LAB_0072937f;
    *puVar6 = 0;
  }
  oldFunctionBody._4_4_ = FunctionProxy::GetLocalFunctionId((FunctionProxy *)functionBody);
  functionBody_local = (FunctionBody *)0x0;
  bVar3 = JsUtil::
          BaseDictionary<unsigned_int,_Js::FunctionBody_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::TryGetValue<unsigned_int>
                    (&((this->functionBodyDictionary).ptr)->
                      super_BaseDictionary<unsigned_int,_Js::FunctionBody_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                     ,(uint *)((long)&oldFunctionBody + 4),&functionBody_local);
  if (bVar3) {
    if (functionBody_local == functionBody) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/Utf8SourceInfo.cpp"
                                  ,0x87,"(oldFunctionBody != functionBody)",
                                  "oldFunctionBody != functionBody");
      if (!bVar3) {
LAB_0072937f:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar6 = 0;
    }
    functionBody_local->field_0x178 = functionBody_local->field_0x178 & 0xf7;
  }
  JsUtil::
  SynchronizedDictionary<unsigned_int,_Js::FunctionBody_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_Js::DefaultContainerLockPolicy,_CriticalSection>
  ::Item((this->functionBodyDictionary).ptr,(uint *)((long)&oldFunctionBody + 4),&local_38);
  *(uint *)&local_38->field_0x178 = *(uint *)&local_38->field_0x178 | 8;
  return;
}

Assistant:

void Utf8SourceInfo::SetFunctionBody(FunctionBody * functionBody)
    {
        Assert(this->m_scriptContext == functionBody->GetScriptContext());
        Assert(this->functionBodyDictionary);

        // Only register a function body when source info is ready. Note that m_pUtf8Source can still be null for lib script.
        Assert(functionBody->GetSourceIndex() != Js::Constants::InvalidSourceIndex);
        Assert(!functionBody->GetIsFuncRegistered());

        const LocalFunctionId functionId = functionBody->GetLocalFunctionId();
        FunctionBody* oldFunctionBody = nullptr;
        if (functionBodyDictionary->TryGetValue(functionId, &oldFunctionBody)) {
            Assert(oldFunctionBody != functionBody);
            oldFunctionBody->SetIsFuncRegistered(false);
        }

        functionBodyDictionary->Item(functionId, functionBody);
        functionBody->SetIsFuncRegistered(true);
    }